

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O1

uint64_t ReadCompactSize<ParamsStream<ParamsStream<HashVerifier<AutoFile>&,CAddress::SerParams>&,CNetAddr::SerParams>>
                   (ParamsStream<ParamsStream<HashVerifier<AutoFile>_&,_CAddress::SerParams>_&,_CNetAddr::SerParams>
                    *is,bool range_check)

{
  HashVerifier<AutoFile> *pHVar1;
  ulong uVar2;
  char *pcVar3;
  size_t in_RCX;
  long in_FS_OFFSET;
  uint8_t obj;
  byte local_40;
  undefined1 uStack_3f;
  undefined2 uStack_3e;
  int iStack_3c;
  undefined8 local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pHVar1 = is->m_substream->m_substream;
  AutoFile::read(pHVar1->m_source,(int)&local_40,(void *)0x1,in_RCX);
  CSHA256::Write((CSHA256 *)pHVar1,&local_40,1);
  uVar2 = (ulong)local_40;
  if (0xfc < uVar2) {
    if (uVar2 == 0xfe) {
      pHVar1 = is->m_substream->m_substream;
      AutoFile::read(pHVar1->m_source,(int)&local_40,(void *)0x4,in_RCX);
      CSHA256::Write((CSHA256 *)pHVar1,&local_40,4);
      uVar2 = (ulong)CONCAT22(uStack_3e,CONCAT11(uStack_3f,local_40));
      if (uVar2 < 0x10000) {
        pcVar3 = (char *)__cxa_allocate_exception(0x20);
        local_38 = std::iostream_category();
        local_40 = 1;
        uStack_3f = 0;
        uStack_3e = 0;
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar3,(error_code *)"non-canonical ReadCompactSize()");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
          __cxa_throw(pcVar3,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_0044078d;
      }
    }
    else if (local_40 == 0xfd) {
      pHVar1 = is->m_substream->m_substream;
      AutoFile::read(pHVar1->m_source,(int)&local_40,(void *)0x2,in_RCX);
      CSHA256::Write((CSHA256 *)pHVar1,&local_40,2);
      uVar2 = (ulong)CONCAT11(uStack_3f,local_40);
      if (uVar2 < 0xfd) {
        pcVar3 = (char *)__cxa_allocate_exception(0x20);
        local_38 = std::iostream_category();
        local_40 = 1;
        uStack_3f = 0;
        uStack_3e = 0;
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar3,(error_code *)"non-canonical ReadCompactSize()");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
          __cxa_throw(pcVar3,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_0044078d;
      }
    }
    else {
      pHVar1 = is->m_substream->m_substream;
      AutoFile::read(pHVar1->m_source,(int)&local_40,&DAT_00000008,in_RCX);
      CSHA256::Write((CSHA256 *)pHVar1,&local_40,8);
      uVar2 = CONCAT44(iStack_3c,CONCAT22(uStack_3e,CONCAT11(uStack_3f,local_40)));
      if (iStack_3c == 0) {
        pcVar3 = (char *)__cxa_allocate_exception(0x20);
        local_38 = std::iostream_category();
        local_40 = 1;
        uStack_3f = 0;
        uStack_3e = 0;
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar3,(error_code *)"non-canonical ReadCompactSize()");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
          __cxa_throw(pcVar3,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_0044078d;
      }
    }
  }
  if (range_check && 0x2000000 < uVar2) {
    pcVar3 = (char *)__cxa_allocate_exception(0x20);
    local_38 = std::iostream_category();
    local_40 = 1;
    uStack_3f = 0;
    uStack_3e = 0;
    std::ios_base::failure[abi:cxx11]::failure
              (pcVar3,(error_code *)"ReadCompactSize(): size too large");
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      __cxa_throw(pcVar3,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return uVar2;
  }
LAB_0044078d:
  __stack_chk_fail();
}

Assistant:

uint64_t ReadCompactSize(Stream& is, bool range_check = true)
{
    uint8_t chSize = ser_readdata8(is);
    uint64_t nSizeRet = 0;
    if (chSize < 253)
    {
        nSizeRet = chSize;
    }
    else if (chSize == 253)
    {
        nSizeRet = ser_readdata16(is);
        if (nSizeRet < 253)
            throw std::ios_base::failure("non-canonical ReadCompactSize()");
    }
    else if (chSize == 254)
    {
        nSizeRet = ser_readdata32(is);
        if (nSizeRet < 0x10000u)
            throw std::ios_base::failure("non-canonical ReadCompactSize()");
    }
    else
    {
        nSizeRet = ser_readdata64(is);
        if (nSizeRet < 0x100000000ULL)
            throw std::ios_base::failure("non-canonical ReadCompactSize()");
    }
    if (range_check && nSizeRet > MAX_SIZE) {
        throw std::ios_base::failure("ReadCompactSize(): size too large");
    }
    return nSizeRet;
}